

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O2

unique_ptr<wabt::FuncType,_std::default_delete<wabt::FuncType>_> __thiscall
wabt::MakeUnique<wabt::FuncType,std::__cxx11::string&>
          (wabt *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  string_view name;
  FuncType *this_00;
  
  this_00 = (FuncType *)operator_new(0x80);
  name.data_ = (args->_M_dataplus)._M_p;
  name.size_ = args->_M_string_length;
  FuncType::FuncType(this_00,name);
  *(FuncType **)this = this_00;
  return (__uniq_ptr_data<wabt::FuncType,_std::default_delete<wabt::FuncType>,_true,_true>)
         (__uniq_ptr_data<wabt::FuncType,_std::default_delete<wabt::FuncType>,_true,_true>)this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}